

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::cleanup
          (SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *this,EVP_PKEY_CTX *ctx)

{
  pointer p;
  pointer pSVar1;
  pointer pSVar2;
  
  if (this->len != 0) {
    pSVar1 = this->data_;
    pSVar2 = pSVar1 + this->len;
    do {
      p = (pSVar1->super_SmallVectorBase<slang::ast::NetAlias>).data_;
      if (p != (pointer)(pSVar1->super_SmallVectorBase<slang::ast::NetAlias>).firstElement) {
        operator_delete(p);
      }
      pSVar1 = pSVar1 + 1;
    } while (pSVar1 != pSVar2);
  }
  if (this->data_ != (pointer)this->firstElement) {
    operator_delete(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }